

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_ftint_u_df_mips64el
               (CPUMIPSState_conflict10 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  long lVar1;
  uint32_t uVar2;
  uint c_00;
  float32 fVar3;
  int iVar4;
  int iVar5;
  float_status *pfVar6;
  uint64_t uVar7;
  float64 fVar8;
  uintptr_t unaff_retaddr;
  int c_1;
  float_status *status_1;
  int c;
  float_status *status;
  uint32_t i;
  wr_t *pws;
  wr_t *pwd;
  wr_t *pwx;
  wr_t wx;
  uint32_t local_18;
  uint32_t ws_local;
  uint32_t wd_local;
  uint32_t df_local;
  CPUMIPSState_conflict10 *env_local;
  
  lVar1 = (ulong)ws * 0x10 + 0x338;
  wx.w[3] = ws;
  local_18 = wd;
  ws_local = df;
  _wd_local = env;
  clear_msacsr_cause(env);
  if (ws_local == 2) {
    for (status._4_4_ = 0; status._4_4_ < 4; status._4_4_ = status._4_4_ + 1) {
      pfVar6 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar6);
      uVar2 = float32_to_uint32_mips64el
                        (*(float32 *)
                          ((long)(env->active_fpu).fpr + (ulong)status._4_4_ * 4 + lVar1 + -0x338),
                         pfVar6);
      ((wr_t *)&pwx)->w[status._4_4_] = uVar2;
      c_00 = update_msacsr(_wd_local,1,0);
      iVar4 = get_enabled_exceptions(_wd_local,c_00);
      if (iVar4 == 0) {
        iVar4 = float32_is_any_nan(*(float32 *)
                                    ((long)(env->active_fpu).fpr +
                                    (ulong)status._4_4_ * 4 + lVar1 + -0x338));
        if (iVar4 != 0) {
          ((wr_t *)&pwx)->w[status._4_4_] = 0;
        }
      }
      else {
        fVar3 = float32_default_nan_mips64el(pfVar6);
        ((wr_t *)&pwx)->w[status._4_4_] = (fVar3 ^ 0x400020) & 0xffffffc0 | c_00;
      }
    }
  }
  else {
    if (ws_local != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1cb3,
                    "void helper_msa_ftint_u_df_mips64el(CPUMIPSState *, uint32_t, uint32_t, uint32_t)"
                   );
    }
    for (status._4_4_ = 0; status._4_4_ < 2; status._4_4_ = status._4_4_ + 1) {
      pfVar6 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar6);
      uVar7 = float64_to_uint64_mips64el
                        (*(float64 *)
                          ((long)(env->active_fpu).fpr + (ulong)status._4_4_ * 8 + lVar1 + -0x338),
                         pfVar6);
      ((wr_t *)&pwx)->d[status._4_4_] = uVar7;
      iVar4 = update_msacsr(_wd_local,1,0);
      iVar5 = get_enabled_exceptions(_wd_local,iVar4);
      if (iVar5 == 0) {
        iVar4 = float64_is_any_nan(*(float64 *)
                                    ((long)(env->active_fpu).fpr +
                                    (ulong)status._4_4_ * 8 + lVar1 + -0x338));
        if (iVar4 != 0) {
          ((wr_t *)&pwx)->d[status._4_4_] = 0;
        }
      }
      else {
        fVar8 = float64_default_nan_mips64el(pfVar6);
        ((wr_t *)&pwx)->d[status._4_4_] =
             (fVar8 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar4;
      }
    }
  }
  check_msacsr_cause(_wd_local,unaff_retaddr);
  msa_move_v((wr_t *)((env->active_fpu).fpr + wd),(wr_t *)&pwx);
  return;
}

Assistant:

void helper_msa_ftint_u_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                           uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP0(pwx->w[i], to_uint32, pws->w[i], 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP0(pwx->d[i], to_uint64, pws->d[i], 64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}